

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  float fVar1;
  float fVar2;
  ImVec2 *pIVar3;
  undefined1 auVar4 [16];
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 in_register_00001244 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 in_register_00001304 [12];
  undefined1 extraout_var [60];
  
  auVar13._4_60_ = in_register_00001244;
  auVar13._0_4_ = a_min;
  iVar8 = (this->_Path).Size;
  if ((radius != 0.0) || (NAN(radius))) {
    iVar8 = num_segments + 1 + iVar8;
    if ((this->_Path).Capacity < iVar8) {
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar8;
      auVar13 = ZEXT464((uint)a_min);
    }
    if (-1 < num_segments) {
      fVar12 = auVar13._0_4_;
      iVar8 = 0;
      do {
        auVar14._0_4_ = (float)iVar8 / (float)num_segments;
        auVar14._4_12_ = in_register_00001304;
        auVar14 = vfmadd132ss_fma(auVar14,auVar13._0_16_,ZEXT416((uint)(a_max - fVar12)));
        fVar1 = center->x;
        fVar10 = cosf(auVar14._0_4_);
        fVar2 = center->y;
        auVar11._0_4_ = sinf(auVar14._0_4_);
        auVar11._4_60_ = extraout_var;
        auVar14 = auVar11._0_16_;
        iVar9 = (this->_Path).Size;
        iVar6 = (this->_Path).Capacity;
        if (iVar9 == iVar6) {
          if (iVar6 == 0) {
            iVar7 = 8;
          }
          else {
            iVar7 = iVar6 / 2 + iVar6;
          }
          iVar9 = iVar9 + 1;
          if (iVar9 < iVar7) {
            iVar9 = iVar7;
          }
          if (iVar6 < iVar9) {
            pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
            pIVar3 = (this->_Path).Data;
            if (pIVar3 != (ImVec2 *)0x0) {
              memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
              ImGui::MemFree((this->_Path).Data);
            }
            (this->_Path).Data = pIVar5;
            (this->_Path).Capacity = iVar9;
            auVar14 = ZEXT416((uint)auVar11._0_4_);
          }
        }
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)radius),ZEXT416((uint)fVar1));
        auVar14 = vfmadd213ss_fma(auVar14,ZEXT416((uint)radius),ZEXT416((uint)fVar2));
        pIVar3 = (this->_Path).Data;
        iVar9 = (this->_Path).Size;
        pIVar3[iVar9].x = auVar4._0_4_;
        pIVar3[iVar9].y = auVar14._0_4_;
        (this->_Path).Size = (this->_Path).Size + 1;
        iVar8 = iVar8 + 1;
        auVar13 = ZEXT464((uint)a_min);
      } while (num_segments + 1 != iVar8);
    }
  }
  else {
    iVar9 = (this->_Path).Capacity;
    if (iVar8 == iVar9) {
      if (iVar9 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar9 / 2 + iVar9;
      }
      iVar7 = iVar8 + 1;
      if (iVar8 + 1 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar9 < iVar7) {
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar7;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius == 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(center.x + ImCos(a) * radius, center.y + ImSin(a) * radius));
    }
}